

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_catalog_entry.cpp
# Opt level: O0

void __thiscall
duckdb::TableCatalogEntry::BindUpdateConstraints
          (TableCatalogEntry *this,Binder *binder,LogicalGet *get,LogicalProjection *proj,
          LogicalUpdate *update,ClientContext *context)

{
  bool bVar1;
  pointer pBVar2;
  physical_index_set_t *bound_columns;
  ColumnList *this_00;
  ColumnDefinition *this_01;
  PhysicalIndex __x;
  undefined1 uVar3;
  TableCatalogEntry *in_RDI;
  long in_R8;
  undefined8 in_R9;
  ColumnListIterator CVar4;
  pair<std::__detail::_Node_iterator<duckdb::PhysicalIndex,_true,_true>,_bool> pVar5;
  ColumnDefinition *column_3;
  ColumnLogicalIteratorInternal __end2_2;
  ColumnLogicalIteratorInternal __begin2_2;
  ColumnListIterator *__range2_2;
  physical_index_set_t all_columns_1;
  ColumnDefinition *column_2;
  PhysicalIndex *col_index;
  iterator __end1_2;
  iterator __begin1_2;
  vector<duckdb::PhysicalIndex,_true> *__range1_2;
  PhysicalIndex *column_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<duckdb::PhysicalIndex,_true> *__range2_1;
  IndexInfo index;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::IndexInfo,_true> *__range1_1;
  TableStorageInfo table_storage_info;
  ColumnDefinition *column;
  ColumnLogicalIteratorInternal __end2;
  ColumnLogicalIteratorInternal __begin2;
  ColumnListIterator *__range2;
  physical_index_set_t all_columns;
  BoundCheckConstraint *check;
  unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
  *constraint;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  *__range1;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  IndexInfo *in_stack_fffffffffffffc90;
  value_type *in_stack_fffffffffffffc98;
  ColumnListIterator *in_stack_fffffffffffffca0;
  undefined6 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcae;
  undefined1 in_stack_fffffffffffffcaf;
  ColumnListIterator *in_stack_fffffffffffffcb0;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  BoundConstraint *in_stack_fffffffffffffcd0;
  ColumnList *in_stack_fffffffffffffce0;
  PhysicalIndex in_stack_fffffffffffffce8;
  PhysicalIndex in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfe;
  undefined1 in_stack_fffffffffffffcff;
  ColumnLogicalIteratorInternal local_2b8;
  ColumnLogicalIteratorInternal local_298;
  ColumnList *local_278;
  undefined1 local_270;
  ColumnList *local_268;
  undefined1 local_260;
  ColumnList **local_258;
  idx_t local_218;
  ColumnDefinition *local_210;
  reference local_208;
  PhysicalIndex *local_200;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  local_1f8;
  physical_index_set_t *in_stack_fffffffffffffe10;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffe18;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffe20;
  LogicalGet *in_stack_fffffffffffffe28;
  iterator in_stack_fffffffffffffe30;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  local_1c8;
  long local_1c0;
  IndexInfo *local_178;
  __normal_iterator<duckdb::IndexInfo_*,_std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>_>
  local_170;
  undefined1 *local_168;
  undefined1 local_160 [8];
  undefined1 auStack_158 [24];
  _Node_iterator_base<duckdb::PhysicalIndex,_true> local_140;
  undefined1 local_138;
  idx_t local_130;
  ColumnDefinition *local_128;
  ColumnLogicalIteratorInternal local_120;
  ColumnLogicalIteratorInternal local_100;
  ColumnList *local_e0;
  undefined1 local_d8;
  ColumnList *local_d0;
  undefined1 local_c8;
  ColumnList **local_c0;
  BoundCheckConstraint *local_80;
  reference local_68;
  unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true> *local_60;
  __normal_iterator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>_>
  local_58;
  undefined1 *local_50;
  undefined1 local_48 [24];
  undefined8 local_30;
  long local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  Binder::BindConstraints
            ((Binder *)
             CONCAT17(in_stack_fffffffffffffcff,
                      CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
             (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
              *)in_stack_fffffffffffffcf0.index,(string *)in_stack_fffffffffffffce8.index,
             in_stack_fffffffffffffce0);
  local_50 = local_48;
  local_58._M_current =
       (unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  local_60 = (unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
              *)::std::
                vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                ::end((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88)), bVar1
        ) {
    local_68 = __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>_>
               ::operator*(&local_58);
    pBVar2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
             ::operator->((unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                           *)in_stack_fffffffffffffc90);
    if (pBVar2->type == CHECK) {
      unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>::
      operator->((unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                  *)in_stack_fffffffffffffc90);
      local_80 = BoundConstraint::Cast<duckdb::BoundCheckConstraint>(in_stack_fffffffffffffcd0);
      LogicalUpdate::BindExtraColumns
                ((TableCatalogEntry *)in_stack_fffffffffffffe30._M_current,in_stack_fffffffffffffe28
                 ,(LogicalProjection *)in_stack_fffffffffffffe20._M_cur,
                 (LogicalUpdate *)in_stack_fffffffffffffe18._M_cur,in_stack_fffffffffffffe10);
    }
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>_>
    ::operator++(&local_58);
  }
  if ((*(byte *)(local_28 + 0x78) & 1) != 0) {
    ::std::
    unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
    ::unordered_set((unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
                     *)0x14fb989);
    GetColumns(in_RDI);
    CVar4 = ColumnList::Physical((ColumnList *)0x14fb99e);
    local_e0 = CVar4.list;
    local_d8 = CVar4.physical;
    local_c0 = &local_d0;
    local_d0 = local_e0;
    local_c8 = local_d8;
    ColumnList::ColumnListIterator::begin(in_stack_fffffffffffffca0);
    ColumnList::ColumnListIterator::end(in_stack_fffffffffffffcb0);
    while (bVar1 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator!=
                             (&local_100,&local_120), bVar1) {
      in_stack_fffffffffffffcf0.index =
           (idx_t)ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)
                             CONCAT17(in_stack_fffffffffffffcaf,
                                      CONCAT16(in_stack_fffffffffffffcae,in_stack_fffffffffffffca8))
                            );
      local_128 = (ColumnDefinition *)in_stack_fffffffffffffcf0.index;
      in_stack_fffffffffffffce8 =
           ColumnDefinition::Physical
                     ((ColumnDefinition *)
                      CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      local_130 = in_stack_fffffffffffffce8.index;
      pVar5 = ::std::
              unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
              ::insert((unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
                        *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      local_140._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<duckdb::PhysicalIndex,_true>._M_cur;
      local_138 = pVar5.second;
      ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator++(&local_100);
    }
    LogicalUpdate::BindExtraColumns
              ((TableCatalogEntry *)in_stack_fffffffffffffe30._M_current,in_stack_fffffffffffffe28,
               (LogicalProjection *)in_stack_fffffffffffffe20._M_cur,
               (LogicalUpdate *)in_stack_fffffffffffffe18._M_cur,in_stack_fffffffffffffe10);
    ::std::
    unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
    ::~unordered_set((unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
                      *)0x14fbb37);
  }
  *(undefined1 *)(local_28 + 200) = 0;
  (*(in_RDI->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x17])
            (local_160,in_RDI,local_30);
  local_168 = auStack_158;
  local_170._M_current =
       (IndexInfo *)
       ::std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>::begin
                 ((vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_> *)
                  CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  local_178 = (IndexInfo *)
              ::std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>::end
                        ((vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_> *)
                         CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::IndexInfo_*,_std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>_>
                             *)in_stack_fffffffffffffc90,
                            (__normal_iterator<duckdb::IndexInfo_*,_std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>_>
                             *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<duckdb::IndexInfo_*,_std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>_>
    ::operator*(&local_170);
    IndexInfo::IndexInfo
              (in_stack_fffffffffffffc90,
               (IndexInfo *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_1c0 = local_28 + 0x80;
    local_1c8._M_current =
         (PhysicalIndex *)
         ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::begin
                   ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                    CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    in_stack_fffffffffffffe30 =
         ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::end
                   ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                    CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                               *)in_stack_fffffffffffffc90,
                              (__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                               *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88)),
          bVar1) {
      in_stack_fffffffffffffe28 =
           (LogicalGet *)
           __gnu_cxx::
           __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
           ::operator*(&local_1c8);
      in_stack_fffffffffffffe20._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::find((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                  (key_type *)0x14fbc6f);
      in_stack_fffffffffffffe18._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      bVar1 = ::std::__detail::operator!=
                        ((_Node_iterator_base<unsigned_long,_false> *)&stack0xfffffffffffffe20,
                         (_Node_iterator_base<unsigned_long,_false> *)&stack0xfffffffffffffe18);
      if (bVar1) {
        *(undefined1 *)(local_28 + 200) = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
      ::operator++(&local_1c8);
    }
    IndexInfo::~IndexInfo((IndexInfo *)0x14fbd28);
    __gnu_cxx::
    __normal_iterator<duckdb::IndexInfo_*,_std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>_>
    ::operator++(&local_170);
  }
  bound_columns = (physical_index_set_t *)(local_28 + 0x80);
  local_1f8._M_current =
       (PhysicalIndex *)
       ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::begin
                 ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                  CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  local_200 = (PhysicalIndex *)
              ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::end
                        ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                         CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                        *)in_stack_fffffffffffffc90,
                       (__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    if (!bVar1) {
LAB_014fbe44:
      if ((*(byte *)(local_28 + 200) & 1) != 0) {
        ::std::
        unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
        ::unordered_set((unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
                         *)0x14fbe66);
        GetColumns(in_RDI);
        CVar4 = ColumnList::Physical((ColumnList *)0x14fbe7b);
        this_00 = CVar4.list;
        uVar3 = CVar4.physical;
        local_258 = &local_268;
        local_278 = this_00;
        local_270 = uVar3;
        local_268 = this_00;
        local_260 = uVar3;
        ColumnList::ColumnListIterator::begin(in_stack_fffffffffffffca0);
        ColumnList::ColumnListIterator::end((ColumnListIterator *)this_00);
        while (bVar1 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator!=
                                 (&local_298,&local_2b8), bVar1) {
          this_01 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)
                               CONCAT17(uVar3,CONCAT16(bVar1,in_stack_fffffffffffffca8)));
          __x = ColumnDefinition::Physical
                          ((ColumnDefinition *)
                           CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
          pVar5 = ::std::
                  unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
                  ::insert((unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
                            *)this_01,(value_type *)__x.index);
          in_stack_fffffffffffffc8f = pVar5.second;
          ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator++(&local_298);
        }
        LogicalUpdate::BindExtraColumns
                  ((TableCatalogEntry *)in_stack_fffffffffffffe30._M_current,
                   in_stack_fffffffffffffe28,(LogicalProjection *)in_stack_fffffffffffffe20._M_cur,
                   (LogicalUpdate *)in_stack_fffffffffffffe18._M_cur,bound_columns);
        ::std::
        unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
        ::~unordered_set((unordered_set<duckdb::PhysicalIndex,_duckdb::PhysicalIndexHashFunction,_std::equal_to<duckdb::PhysicalIndex>,_std::allocator<duckdb::PhysicalIndex>_>
                          *)0x14fc011);
      }
      TableStorageInfo::~TableStorageInfo((TableStorageInfo *)0x14fc01e);
      vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
      ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                 *)0x14fc02b);
      return;
    }
    local_208 = __gnu_cxx::
                __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                ::operator*(&local_1f8);
    GetColumns(in_RDI);
    local_218 = local_208->index;
    local_210 = ColumnList::GetColumn
                          ((ColumnList *)in_stack_fffffffffffffce8.index,in_stack_fffffffffffffcf0);
    ColumnDefinition::Type(local_210);
    in_stack_fffffffffffffcbf =
         LogicalType::SupportsRegularUpdate
                   ((LogicalType *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    if (!(bool)in_stack_fffffffffffffcbf) {
      *(undefined1 *)(local_28 + 200) = 1;
      goto LAB_014fbe44;
    }
    __gnu_cxx::
    __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
    ::operator++(&local_1f8);
  } while( true );
}

Assistant:

void TableCatalogEntry::BindUpdateConstraints(Binder &binder, LogicalGet &get, LogicalProjection &proj,
                                              LogicalUpdate &update, ClientContext &context) {
	// check the constraints and indexes of the table to see if we need to project any additional columns
	// we do this for indexes with multiple columns and CHECK constraints in the UPDATE clause
	// suppose we have a constraint CHECK(i + j < 10); now we need both i and j to check the constraint
	// if we are only updating one of the two columns we add the other one to the UPDATE set
	// with a "useless" update (i.e. i=i) so we can verify that the CHECK constraint is not violated
	auto bound_constraints = binder.BindConstraints(constraints, name, columns);
	for (auto &constraint : bound_constraints) {
		if (constraint->type == ConstraintType::CHECK) {
			auto &check = constraint->Cast<BoundCheckConstraint>();
			// check constraint! check if we need to add any extra columns to the UPDATE clause
			LogicalUpdate::BindExtraColumns(*this, get, proj, update, check.bound_columns);
		}
	}
	if (update.return_chunk) {
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
	// for index updates we always turn any update into an insert and a delete
	// we thus need all the columns to be available, hence we check if the update touches any index columns
	// If the returning keyword is used, we need access to the whole row in case the user requests it.
	// Therefore switch the update to a delete and insert.
	update.update_is_del_and_insert = false;
	TableStorageInfo table_storage_info = GetStorageInfo(context);
	for (auto index : table_storage_info.index_info) {
		for (auto &column : update.columns) {
			if (index.column_set.find(column.index) != index.column_set.end()) {
				update.update_is_del_and_insert = true;
				break;
			}
		}
	};

	// we also convert any updates on LIST columns into delete + insert
	for (auto &col_index : update.columns) {
		auto &column = GetColumns().GetColumn(col_index);
		if (!column.Type().SupportsRegularUpdate()) {
			update.update_is_del_and_insert = true;
			break;
		}
	}

	if (update.update_is_del_and_insert) {
		// the update updates a column required by an index or requires returning the updated rows,
		// push projections for all columns
		physical_index_set_t all_columns;
		for (auto &column : GetColumns().Physical()) {
			all_columns.insert(column.Physical());
		}
		LogicalUpdate::BindExtraColumns(*this, get, proj, update, all_columns);
	}
}